

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::PropertyMatcher<int(test::syntax_tests::X::*)()const,int>::operator()
          (AssertionResult *__return_storage_ptr__,
          PropertyMatcher<int(test::syntax_tests::X::*)()const,int> *this,X **actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  X **local_20;
  X **actual_local;
  PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int> *this_local;
  
  local_20 = actual;
  actual_local = (X **)this;
  this_local = (PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int> *)
               __return_storage_ptr__;
  bVar1 = Check<test::syntax_tests::X*>
                    (this,actual,(type **)&iutest_type_traits::enabler_t<void>::value);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }